

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcValue::invalidate(XmlRpcValue *this)

{
  string *this_00;
  void *pvVar1;
  undefined4 *in_RDI;
  vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *in_stack_ffffffffffffffd0;
  vector<char,_std::allocator<char>_> *this_01;
  
  switch(*in_RDI) {
  case 4:
    this_00 = *(string **)(in_RDI + 2);
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00,0x20);
    }
    break;
  case 5:
    if (*(void **)(in_RDI + 2) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 2),0x38);
    }
    break;
  case 6:
    this_01 = *(vector<char,_std::allocator<char>_> **)(in_RDI + 2);
    if (this_01 != (vector<char,_std::allocator<char>_> *)0x0) {
      std::vector<char,_std::allocator<char>_>::~vector(this_01);
      operator_delete(this_01,0x18);
    }
    break;
  case 7:
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      std::vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_>::~vector
                (in_stack_ffffffffffffffd0);
      operator_delete(pvVar1,0x18);
    }
    break;
  case 8:
    pvVar1 = *(void **)(in_RDI + 2);
    if (pvVar1 != (void *)0x0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
              *)0x56b623);
      operator_delete(pvVar1,0x30);
    }
  }
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  return;
}

Assistant:

void XmlRpcValue::invalidate()
  {
    switch (_type) {
      case TypeString:    delete _value.asString; break;
      case TypeDateTime:  delete _value.asTime;   break;
      case TypeBase64:    delete _value.asBinary; break;
      case TypeArray:     delete _value.asArray;  break;
      case TypeStruct:    delete _value.asStruct; break;
      default: break;
    }
    _type = TypeInvalid;
    _value.asBinary = 0;
  }